

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

wchar_t strncat_from_utf8_to_utf8(archive_string *as,void *_src,size_t len,archive_string_conv *sc)

{
  char *pcVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  archive_string *paVar4;
  size_t s;
  char *s_00;
  bool bVar5;
  uint32_t uc;
  char t [4];
  uint local_4c;
  uint local_48;
  uint local_44;
  archive_string *local_40;
  char local_34 [4];
  
  local_40 = as;
  paVar4 = archive_string_ensure(as,len + as->length + 1);
  if (paVar4 == (archive_string *)0x0) {
    wVar2 = L'\xffffffff';
  }
  else {
    local_4c = 0;
    do {
      local_44 = (uint)paVar4;
      s_00 = (char *)_src;
      while( true ) {
        wVar2 = _utf8_to_unicode(&local_48,s_00,len);
        if ((wVar2 != L'\x03') || (wVar3 = L'\xfffffffd', (local_48 & 0xfffff800) != 0xd800)) {
          wVar3 = wVar2;
        }
        if (wVar3 < L'\x01') break;
        s_00 = s_00 + (uint)wVar3;
        len = len - (uint)wVar3;
      }
      pcVar1 = (char *)_src;
      if ((s_00 < _src || (long)s_00 - (long)_src == 0) ||
         (paVar4 = archive_string_append(local_40,(char *)_src,(long)s_00 - (long)_src),
         pcVar1 = s_00, paVar4 != (archive_string *)0x0)) {
        _src = pcVar1;
        if (wVar3 == L'\0') {
          bVar5 = false;
          paVar4 = (archive_string *)(ulong)local_4c;
        }
        else {
          if ((wVar3 == L'\xfffffffd') && ((local_48 & 0xfffff800) == 0xd800)) {
            wVar3 = cesu8_to_unicode(&local_48,(char *)_src,len);
          }
          if (wVar3 < L'\0') {
            local_4c = 0xffffffff;
          }
          wVar2 = -wVar3;
          if (L'\0' < wVar3) {
            wVar2 = wVar3;
          }
          _src = (void *)((long)_src + (ulong)(uint)wVar2);
          len = len - (uint)wVar2;
          s = unicode_to_utf8(local_34,4,local_48);
          paVar4 = archive_string_append(local_40,local_34,s);
          bVar5 = paVar4 != (archive_string *)0x0;
          paVar4 = (archive_string *)(ulong)(local_44 | -(uint)(paVar4 == (archive_string *)0x0));
        }
      }
      else {
        paVar4 = (archive_string *)0xffffffff;
        bVar5 = false;
      }
      wVar2 = (wchar_t)paVar4;
    } while (bVar5);
  }
  return wVar2;
}

Assistant:

static int
strncat_from_utf8_to_utf8(struct archive_string *as, const void *_src,
    size_t len, struct archive_string_conv *sc)
{
	int ret = 0;
	const char *src = _src;
	(void)sc; /* UNUSED */

	/* Pre-extend the destination */
	if (archive_string_ensure(as, as->length + len + 1) == NULL)
		return (-1);

	/* Invariant: src points to the first UTF8 byte that hasn't
	 * been copied to the destination `as`. */
	for (;;) {
		int n;
		uint32_t uc;
		const char *e = src;

		/* Skip UTF-8 sequences until we reach end-of-string or
		 * a code point that needs conversion. */
		while ((n = utf8_to_unicode(&uc, e, len)) > 0) {
			e += n;
			len -= n;
		}
		/* Copy the part that doesn't need conversion */
		if (e > src) {
			if (archive_string_append(as, src, e - src) == NULL)
				return (-1);
			src = e;
		}

		if (n == 0) {
			/* We reached end-of-string */
			return (ret);
		} else {
			/* Next code point needs conversion */
			char t[4];
			size_t w;

			/* Try decoding a surrogate pair */
			if (n == -3 && IS_SURROGATE_PAIR_LA(uc)) {
				n = cesu8_to_unicode(&uc, src, len);
			}
			/* Not a (valid) surrogate, so use a replacement char */
			if (n < 0) {
				ret = -1; /* Return -1 if we used any replacement */
				n *= -1;
			}
			/* Consume converted code point */
			src += n;
			len -= n;
			/* Convert and append new UTF-8 sequence. */
			w = unicode_to_utf8(t, sizeof(t), uc);
			if (archive_string_append(as, t, w) == NULL)
				return (-1);
		}
	}
}